

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro
          (sysbvm_context_t *context,sysbvm_tuple_t *node,sysbvm_tuple_t *macro,
          sysbvm_tuple_t *environment)

{
  sysbvm_tuple_t sVar1;
  size_t local_138;
  size_t i;
  sysbvm_stackFrameGCRootsRecord_t callFrameStackRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_8_1_f749f241 gcFrame;
  sysbvm_functionCallFrameStack_t callFrameStack;
  size_t applicationArgumentCount;
  sysbvm_astUnexpandedApplicationNode_t **unexpandedNode;
  sysbvm_tuple_t *environment_local;
  sysbvm_tuple_t *macro_local;
  sysbvm_tuple_t *node_local;
  sysbvm_context_t *context_local;
  
  callFrameStack.gcRoots.applicationArguments[0xf] =
       sysbvm_array_getSize(*(sysbvm_tuple_t *)(*node + 0x30));
  memset(&gcFrame,0,0xb0);
  memset(&gcFrameRecord.roots,0,8);
  memset(&callFrameStackRecord.roots,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&callFrameStackRecord.roots);
  memset(&i,0,0x20);
  callFrameStackRecord.previous._0_4_ = 0;
  callFrameStackRecord.type = 0x11;
  callFrameStackRecord._12_4_ = 0;
  callFrameStackRecord.rootCount = (size_t)&callFrameStack.argumentIndex;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&i);
  sysbvm_functionCallFrameStack_begin
            (context,(sysbvm_functionCallFrameStack_t *)&gcFrame,*macro,
             callFrameStack.gcRoots.applicationArguments[0xf] + 1,0);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_macroContext_create(context,*node,*(sysbvm_tuple_t *)(*node + 0x10),*environment);
  sysbvm_functionCallFrameStack_push
            ((sysbvm_functionCallFrameStack_t *)&gcFrame,(sysbvm_tuple_t)gcFrameRecord.roots);
  for (local_138 = 0; local_138 < callFrameStack.gcRoots.applicationArguments[0xf];
      local_138 = local_138 + 1) {
    sVar1 = sysbvm_array_at(*(sysbvm_tuple_t *)(*node + 0x30),local_138);
    sysbvm_functionCallFrameStack_push((sysbvm_functionCallFrameStack_t *)&gcFrame,sVar1);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&i);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&callFrameStackRecord.roots);
  sVar1 = sysbvm_functionCallFrameStack_finish(context,(sysbvm_functionCallFrameStack_t *)&gcFrame);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astUnexpandedApplicationNode_expandNodeWithMacro(sysbvm_context_t *context, sysbvm_tuple_t *node, sysbvm_tuple_t *macro, sysbvm_tuple_t *environment)
{
    sysbvm_astUnexpandedApplicationNode_t **unexpandedNode = (sysbvm_astUnexpandedApplicationNode_t**)node;

    size_t applicationArgumentCount = sysbvm_array_getSize((*unexpandedNode)->arguments);

    sysbvm_functionCallFrameStack_t callFrameStack = {0};
    struct {
        sysbvm_tuple_t macroContext;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(callFrameStackRecord, callFrameStack.gcRoots);

    sysbvm_functionCallFrameStack_begin(context, &callFrameStack, *macro, 1 + applicationArgumentCount, 0);
    gcFrame.macroContext = sysbvm_macroContext_create(context, *node, (*unexpandedNode)->super.sourcePosition, *environment);
    sysbvm_functionCallFrameStack_push(&callFrameStack, gcFrame.macroContext);
    for(size_t i = 0; i < applicationArgumentCount; ++i)
        sysbvm_functionCallFrameStack_push(&callFrameStack, sysbvm_array_at((*unexpandedNode)->arguments, i));

    SYSBVM_STACKFRAME_POP_GC_ROOTS(callFrameStackRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionCallFrameStack_finish(context, &callFrameStack);
}